

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_buffer_access.cpp
# Opt level: O0

void __thiscall
lower_buffer_access::lower_buffer_access::setup_buffer_access
          (lower_buffer_access *this,void *mem_ctx,ir_rvalue *deref,ir_rvalue **offset,
          uint *const_offset,bool *row_major,glsl_type **matrix_type,
          glsl_struct_field **struct_field,glsl_interface_packing packing)

{
  ir_rvalue **ppiVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ir_constant *piVar5;
  glsl_type *pgVar6;
  undefined4 extraout_var;
  ir_expression *piVar7;
  ir_dereference_record *this_00;
  glsl_type *pgVar8;
  ir_swizzle *deref_swizzle;
  uint field_align;
  bool field_row_major;
  ir_dereference_record *field_deref;
  glsl_type *type;
  uint i;
  uint intra_struct_offset;
  glsl_type *struct_type;
  ir_dereference_record *deref_record;
  operand local_78;
  operand local_70;
  operand local_68;
  long local_60;
  ir_constant *const_index;
  ir_expression *local_50;
  ir_rvalue *array_index;
  bool array_row_major;
  ir_rvalue *piStack_40;
  uint array_stride;
  ir_dereference_array *deref_array;
  bool *row_major_local;
  uint *const_offset_local;
  ir_rvalue **offset_local;
  ir_rvalue *deref_local;
  void *mem_ctx_local;
  lower_buffer_access *this_local;
  
  deref_array = (ir_dereference_array *)row_major;
  row_major_local = (bool *)const_offset;
  const_offset_local = (uint *)offset;
  offset_local = (ir_rvalue **)deref;
  deref_local = (ir_rvalue *)mem_ctx;
  mem_ctx_local = this;
  piVar5 = (ir_constant *)exec_node::operator_new(0xb0,mem_ctx);
  ir_constant::ir_constant(piVar5,0,1);
  *(ir_constant **)const_offset_local = piVar5;
  bVar2 = is_dereferenced_thing_row_major(this,(ir_rvalue *)offset_local);
  *(bool *)&(deref_array->super_ir_dereference).super_ir_rvalue.super_ir_instruction.
            _vptr_ir_instruction = bVar2;
  *matrix_type = (glsl_type *)0x0;
  do {
    ppiVar1 = offset_local;
    if (offset_local == (ir_rvalue **)0x0) {
      return;
    }
    switch(*(undefined4 *)(offset_local + 3)) {
    case 0:
      piStack_40 = (ir_rvalue *)offset_local;
      bVar2 = glsl_type::is_vector(offset_local[5]->type);
      if (bVar2) {
        array_index._4_4_ = 4;
        bVar2 = glsl_type::is_64bit((glsl_type *)
                                    piStack_40[1].super_ir_instruction._vptr_ir_instruction[4]);
        if (bVar2) {
          array_index._4_4_ = array_index._4_4_ << 1;
        }
      }
      else {
        bVar2 = glsl_type::is_matrix
                          ((glsl_type *)piStack_40[1].super_ir_instruction._vptr_ir_instruction[4]);
        if ((bVar2) &&
           (((ulong)(deref_array->super_ir_dereference).super_ir_rvalue.super_ir_instruction.
                    _vptr_ir_instruction & 1) != 0)) {
          array_index._4_4_ = 4;
          bVar2 = glsl_type::is_64bit((glsl_type *)
                                      piStack_40[1].super_ir_instruction._vptr_ir_instruction[4]);
          if (bVar2) {
            array_index._4_4_ = array_index._4_4_ << 1;
          }
          *matrix_type = (glsl_type *)piStack_40[1].super_ir_instruction._vptr_ir_instruction[4];
        }
        else {
          pgVar6 = glsl_type::without_array(piStack_40->type);
          bVar2 = glsl_type::is_interface(pgVar6);
          if (bVar2) {
            offset_local = (ir_rvalue **)
                           ir_instruction::as_dereference
                                     ((ir_instruction *)
                                      piStack_40[1].super_ir_instruction._vptr_ir_instruction);
            break;
          }
          array_index._3_1_ = is_dereferenced_thing_row_major(this,piStack_40);
          if (packing == GLSL_INTERFACE_PACKING_STD430) {
            array_index._4_4_ =
                 glsl_type::std430_array_stride(piStack_40->type,(bool)array_index._3_1_);
          }
          else {
            array_index._4_4_ = glsl_type::std140_size(piStack_40->type,(bool)array_index._3_1_);
            array_index._4_4_ = glsl_align(array_index._4_4_,0x10);
          }
        }
      }
      local_50 = (ir_expression *)piStack_40[1].super_ir_instruction.super_exec_node.next;
      if ((*(uint *)&((local_50->super_ir_rvalue).type)->field_0x4 & 0xff) == 1) {
        ir_builder::operand::operand((operand *)&const_index,(ir_rvalue *)local_50);
        local_50 = ir_builder::i2u((operand)const_index);
      }
      iVar3 = (*(local_50->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[6])
                        (local_50,deref_local,0);
      local_60 = CONCAT44(extraout_var,iVar3);
      if (local_60 == 0) {
        ir_builder::operand::operand(&local_68,*(ir_rvalue **)const_offset_local);
        ir_builder::operand::operand(&local_78,&local_50->super_ir_rvalue);
        piVar5 = (ir_constant *)exec_node::operator_new(0xb0,deref_local);
        ir_constant::ir_constant(piVar5,array_index._4_4_,1);
        ir_builder::operand::operand((operand *)&deref_record,(ir_rvalue *)piVar5);
        piVar7 = ir_builder::mul(local_78,(operand)deref_record);
        ir_builder::operand::operand(&local_70,&piVar7->super_ir_rvalue);
        piVar7 = ir_builder::add(local_68,local_70);
        *(ir_expression **)const_offset_local = piVar7;
      }
      else {
        *(uint *)row_major_local =
             array_index._4_4_ * *(int *)(local_60 + 0x28) + *(int *)row_major_local;
      }
      offset_local = (ir_rvalue **)
                     ir_instruction::as_dereference
                               ((ir_instruction *)
                                piStack_40[1].super_ir_instruction._vptr_ir_instruction);
      break;
    case 1:
      pgVar6 = offset_local[5]->type;
      type._4_4_ = 0;
      for (type._0_4_ = 0; (uint)type < pgVar6->length; type._0_4_ = (uint)type + 1) {
        pgVar8 = *(glsl_type **)((pgVar6->fields).array + (uint)type);
        this_00 = (ir_dereference_record *)exec_node::operator_new(0x38,deref_local);
        ir_dereference_record::ir_dereference_record
                  (this_00,ppiVar1[5],*(char **)&(pgVar6->fields).array[(uint)type].vector_elements)
        ;
        bVar2 = is_dereferenced_thing_row_major(this,(ir_rvalue *)this_00);
        ralloc_free(this_00);
        if (packing == GLSL_INTERFACE_PACKING_STD430) {
          deref_swizzle._0_4_ = glsl_type::std430_base_alignment(pgVar8,bVar2);
        }
        else {
          deref_swizzle._0_4_ = glsl_type::std140_base_alignment(pgVar8,bVar2);
        }
        if (*(int *)((long)&(pgVar6->fields).array[(uint)type].name + 4) != -1) {
          type._4_4_ = *(uint *)((long)&(pgVar6->fields).array[(uint)type].name + 4);
        }
        type._4_4_ = glsl_align(type._4_4_,(uint)deref_swizzle);
        if (*(int *)(ppiVar1 + 6) < 0) {
          __assert_fail("deref_record->field_idx >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_buffer_access.cpp"
                        ,0x18e,
                        "void lower_buffer_access::lower_buffer_access::setup_buffer_access(void *, ir_rvalue *, ir_rvalue **, unsigned int *, bool *, const glsl_type **, const glsl_struct_field **, enum glsl_interface_packing)"
                       );
        }
        if ((uint)type == *(uint *)(ppiVar1 + 6)) {
          if (struct_field != (glsl_struct_field **)0x0) {
            *struct_field = (glsl_struct_field *)((pgVar6->fields).array + (uint)type);
          }
          break;
        }
        if (packing == GLSL_INTERFACE_PACKING_STD430) {
          uVar4 = glsl_type::std430_size(pgVar8,bVar2);
        }
        else {
          uVar4 = glsl_type::std140_size(pgVar8,bVar2);
        }
        type._4_4_ = uVar4 + type._4_4_;
        pgVar8 = glsl_type::without_array(pgVar8);
        bVar2 = glsl_type::is_struct(pgVar8);
        if (bVar2) {
          type._4_4_ = glsl_align(type._4_4_,(uint)deref_swizzle);
        }
      }
      *(uint *)row_major_local = type._4_4_ + *(int *)row_major_local;
      offset_local = (ir_rvalue **)ir_instruction::as_dereference(&ppiVar1[5]->super_ir_instruction)
      ;
      break;
    case 2:
      offset_local = (ir_rvalue **)0x0;
      break;
    default:
      __assert_fail("!\"not reached\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_buffer_access.cpp"
                    ,0x1b8,
                    "void lower_buffer_access::lower_buffer_access::setup_buffer_access(void *, ir_rvalue *, ir_rvalue **, unsigned int *, bool *, const glsl_type **, const glsl_struct_field **, enum glsl_interface_packing)"
                   );
    case 5:
      if ((*(ushort *)(offset_local + 6) >> 8 & 7) != 1) {
        __assert_fail("deref_swizzle->mask.num_components == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_buffer_access.cpp"
                      ,0x1b0,
                      "void lower_buffer_access::lower_buffer_access::setup_buffer_access(void *, ir_rvalue *, ir_rvalue **, unsigned int *, bool *, const glsl_type **, const glsl_struct_field **, enum glsl_interface_packing)"
                     );
      }
      *(uint *)row_major_local =
           *(int *)row_major_local + (uint)(*(ushort *)(offset_local + 6) & 3) * 4;
      offset_local = (ir_rvalue **)
                     ir_instruction::as_dereference(&offset_local[5]->super_ir_instruction);
    }
  } while( true );
}

Assistant:

void
lower_buffer_access::setup_buffer_access(void *mem_ctx,
                                         ir_rvalue *deref,
                                         ir_rvalue **offset,
                                         unsigned *const_offset,
                                         bool *row_major,
                                         const glsl_type **matrix_type,
                                         const glsl_struct_field **struct_field,
                                         enum glsl_interface_packing packing)
{
   *offset = new(mem_ctx) ir_constant(0u);
   *row_major = is_dereferenced_thing_row_major(deref);
   *matrix_type = NULL;

   /* Calculate the offset to the start of the region of the UBO
    * dereferenced by *rvalue.  This may be a variable offset if an
    * array dereference has a variable index.
    */
   while (deref) {
      switch (deref->ir_type) {
      case ir_type_dereference_variable: {
         deref = NULL;
         break;
      }

      case ir_type_dereference_array: {
         ir_dereference_array *deref_array = (ir_dereference_array *) deref;
         unsigned array_stride;
         if (deref_array->array->type->is_vector()) {
            /* We get this when storing or loading a component out of a vector
             * with a non-constant index. This happens for v[i] = f where v is
             * a vector (or m[i][j] = f where m is a matrix). If we don't
             * lower that here, it gets turned into v = vector_insert(v, i,
             * f), which loads the entire vector, modifies one component and
             * then write the entire thing back.  That breaks if another
             * thread or SIMD channel is modifying the same vector.
             */
            array_stride = 4;
            if (deref_array->array->type->is_64bit())
               array_stride *= 2;
         } else if (deref_array->array->type->is_matrix() && *row_major) {
            /* When loading a vector out of a row major matrix, the
             * step between the columns (vectors) is the size of a
             * float, while the step between the rows (elements of a
             * vector) is handled below in emit_ubo_loads.
             */
            array_stride = 4;
            if (deref_array->array->type->is_64bit())
               array_stride *= 2;
            *matrix_type = deref_array->array->type;
         } else if (deref_array->type->without_array()->is_interface()) {
            /* We're processing an array dereference of an interface instance
             * array. The thing being dereferenced *must* be a variable
             * dereference because interfaces cannot be embedded in other
             * types. In terms of calculating the offsets for the lowering
             * pass, we don't care about the array index. All elements of an
             * interface instance array will have the same offsets relative to
             * the base of the block that backs them.
             */
            deref = deref_array->array->as_dereference();
            break;
         } else {
            /* Whether or not the field is row-major (because it might be a
             * bvec2 or something) does not affect the array itself. We need
             * to know whether an array element in its entirety is row-major.
             */
            const bool array_row_major =
               is_dereferenced_thing_row_major(deref_array);

            /* The array type will give the correct interface packing
             * information
             */
            if (packing == GLSL_INTERFACE_PACKING_STD430) {
               array_stride = deref_array->type->std430_array_stride(array_row_major);
            } else {
               array_stride = deref_array->type->std140_size(array_row_major);
               array_stride = glsl_align(array_stride, 16);
            }
         }

         ir_rvalue *array_index = deref_array->array_index;
         if (array_index->type->base_type == GLSL_TYPE_INT)
            array_index = i2u(array_index);

         ir_constant *const_index =
            array_index->constant_expression_value(mem_ctx, NULL);
         if (const_index) {
            *const_offset += array_stride * const_index->value.u[0];
         } else {
            *offset = add(*offset,
                          mul(array_index,
                              new(mem_ctx) ir_constant(array_stride)));
         }
         deref = deref_array->array->as_dereference();
         break;
      }

      case ir_type_dereference_record: {
         ir_dereference_record *deref_record = (ir_dereference_record *) deref;
         const glsl_type *struct_type = deref_record->record->type;
         unsigned intra_struct_offset = 0;

         for (unsigned int i = 0; i < struct_type->length; i++) {
            const glsl_type *type = struct_type->fields.structure[i].type;

            ir_dereference_record *field_deref = new(mem_ctx)
               ir_dereference_record(deref_record->record,
                                     struct_type->fields.structure[i].name);
            const bool field_row_major =
               is_dereferenced_thing_row_major(field_deref);

            ralloc_free(field_deref);

            unsigned field_align = 0;

            if (packing == GLSL_INTERFACE_PACKING_STD430)
               field_align = type->std430_base_alignment(field_row_major);
            else
               field_align = type->std140_base_alignment(field_row_major);

            if (struct_type->fields.structure[i].offset != -1) {
               intra_struct_offset = struct_type->fields.structure[i].offset;
            }

            intra_struct_offset = glsl_align(intra_struct_offset, field_align);

            assert(deref_record->field_idx >= 0);
            if (i == (unsigned) deref_record->field_idx) {
               if (struct_field)
                  *struct_field = &struct_type->fields.structure[i];
               break;
            }

            if (packing == GLSL_INTERFACE_PACKING_STD430)
               intra_struct_offset += type->std430_size(field_row_major);
            else
               intra_struct_offset += type->std140_size(field_row_major);

            /* If the field just examined was itself a structure, apply rule
             * #9:
             *
             *     "The structure may have padding at the end; the base offset
             *     of the member following the sub-structure is rounded up to
             *     the next multiple of the base alignment of the structure."
             */
            if (type->without_array()->is_struct()) {
               intra_struct_offset = glsl_align(intra_struct_offset,
                                                field_align);

            }
         }

         *const_offset += intra_struct_offset;
         deref = deref_record->record->as_dereference();
         break;
      }

      case ir_type_swizzle: {
         ir_swizzle *deref_swizzle = (ir_swizzle *) deref;

         assert(deref_swizzle->mask.num_components == 1);

         *const_offset += deref_swizzle->mask.x * sizeof(int);
         deref = deref_swizzle->val->as_dereference();
         break;
      }

      default:
         assert(!"not reached");
         deref = NULL;
         break;
      }
   }
}